

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astMessageSendNode_primitiveCompileIntoBytecode
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_functionBytecodeDirectCompiler_t *compiler_;
  _Bool _Var1;
  _Bool _Var2;
  sysbvm_tuple_t *psVar3;
  sysbvm_tuple_t selector;
  size_t slotCount;
  sysbvm_tuple_t arguments_00;
  sysbvm_tuple_t sVar4;
  _Bool isControlFlowEscape;
  size_t sStack_a8;
  _Bool isVoidType;
  size_t i;
  size_t sendArgumentCount;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_56_7_99515cb6 gcFrame;
  sysbvm_astMessageSendNode_t **sendNode;
  sysbvm_functionBytecodeDirectCompiler_t **compiler;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  psVar3 = arguments + 1;
  memset(&gcFrameRecord.roots,0,0x38);
  memset(&sendArgumentCount,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_LANDING_PAD;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sendArgumentCount);
  gcFrameRecord.roots =
       (sysbvm_tuple_t *)
       sysbvm_functionBytecodeDirectCompiler_compileASTNode
                 (context,(sysbvm_functionBytecodeDirectCompiler_t *)*psVar3,
                  *(sysbvm_tuple_t *)(*arguments + 0x28));
  if (*(long *)(*arguments + 0x30) != 0) {
    gcFrame.receiver =
         sysbvm_functionBytecodeDirectCompiler_compileASTNode
                   (context,(sysbvm_functionBytecodeDirectCompiler_t *)*psVar3,
                    *(sysbvm_tuple_t *)(*arguments + 0x30));
  }
  selector = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                       (context,(sysbvm_functionBytecodeDirectCompiler_t *)*psVar3,
                        *(sysbvm_tuple_t *)(*arguments + 0x38));
  slotCount = sysbvm_array_getSize(*(sysbvm_tuple_t *)(*arguments + 0x40));
  arguments_00 = sysbvm_array_create(context,slotCount);
  for (sStack_a8 = 0; sStack_a8 < slotCount; sStack_a8 = sStack_a8 + 1) {
    compiler_ = (sysbvm_functionBytecodeDirectCompiler_t *)*psVar3;
    sVar4 = sysbvm_array_at(*(sysbvm_tuple_t *)(*arguments + 0x40),sStack_a8);
    sVar4 = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context,compiler_,sVar4);
    sysbvm_array_atPut(arguments_00,sStack_a8,sVar4);
  }
  _Var1 = sysbvm_type_isDirectSubtypeOf
                    (*(sysbvm_tuple_t *)(*arguments + 0x20),(context->roots).voidType);
  _Var2 = sysbvm_type_isDirectSubtypeOf
                    (*(sysbvm_tuple_t *)(*arguments + 0x20),(context->roots).controlFlowEscapeType);
  if (_Var1) {
    gcFrame.argument = 0;
    gcFrame.resultTemporary =
         sysbvm_functionBytecodeAssembler_addLiteral
                   (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar3 + 0x10),0x2f);
  }
  else {
    gcFrame.argument =
         sysbvm_functionBytecodeAssembler_newTemporary
                   (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar3 + 0x10),
                    *(sysbvm_tuple_t *)(*arguments + 0x20));
    gcFrame.resultTemporary = gcFrame.argument;
  }
  if (*(long *)(*arguments + 0x30) == 0) {
    sysbvm_functionBytecodeAssembler_send
              (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar3 + 0x10),gcFrame.argument,
               selector,(sysbvm_tuple_t)gcFrameRecord.roots,arguments_00);
  }
  else {
    sysbvm_functionBytecodeAssembler_sendWithLookupReceiverType
              (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar3 + 0x10),gcFrame.argument,
               gcFrame.receiver,selector,(sysbvm_tuple_t)gcFrameRecord.roots,arguments_00);
  }
  if (_Var2) {
    sysbvm_functionBytecodeAssembler_unreachable
              (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar3 + 0x10));
  }
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sendArgumentCount);
  return gcFrame.resultTemporary;
}

Assistant:

static sysbvm_tuple_t sysbvm_astMessageSendNode_primitiveCompileIntoBytecode(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_functionBytecodeDirectCompiler_t **compiler = (sysbvm_functionBytecodeDirectCompiler_t **)&arguments[1];

    sysbvm_astMessageSendNode_t **sendNode = (sysbvm_astMessageSendNode_t**)node;
    struct {
        sysbvm_tuple_t receiver;
        sysbvm_tuple_t receiverLookupType;
        sysbvm_tuple_t selector;
        sysbvm_tuple_t arguments;
        sysbvm_tuple_t argument;
        sysbvm_tuple_t resultTemporary;
        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.receiver = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, (*sendNode)->receiver);
    if((*sendNode)->receiverLookupType)
        gcFrame.receiverLookupType = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, (*sendNode)->receiverLookupType);
    gcFrame.selector = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, (*sendNode)->selector);

    size_t sendArgumentCount = sysbvm_array_getSize((*sendNode)->arguments);
    gcFrame.arguments = sysbvm_array_create(context, sendArgumentCount);
    for(size_t i = 0; i < sendArgumentCount; ++i)
    {
        gcFrame.argument = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, sysbvm_array_at((*sendNode)->arguments, i));
        sysbvm_array_atPut(gcFrame.arguments, i, gcFrame.argument);
    }

    bool isVoidType = sysbvm_type_isDirectSubtypeOf((*sendNode)->super.analyzedType, context->roots.voidType);
    bool isControlFlowEscape = sysbvm_type_isDirectSubtypeOf((*sendNode)->super.analyzedType, context->roots.controlFlowEscapeType);
    if(isVoidType)
    {
        gcFrame.resultTemporary = SYSBVM_NULL_TUPLE;
        gcFrame.result = sysbvm_functionBytecodeAssembler_addLiteral(context, (*compiler)->assembler, SYSBVM_VOID_TUPLE);
    }
    else
    {
        gcFrame.resultTemporary = sysbvm_functionBytecodeAssembler_newTemporary(context, (*compiler)->assembler, (*sendNode)->super.analyzedType);
        gcFrame.result = gcFrame.resultTemporary;
    }

    if((*sendNode)->receiverLookupType)
        sysbvm_functionBytecodeAssembler_sendWithLookupReceiverType(context, (*compiler)->assembler, gcFrame.resultTemporary, gcFrame.receiverLookupType, gcFrame.selector, gcFrame.receiver, gcFrame.arguments);
    else
        sysbvm_functionBytecodeAssembler_send(context, (*compiler)->assembler, gcFrame.resultTemporary, gcFrame.selector, gcFrame.receiver, gcFrame.arguments);

    if(isControlFlowEscape)
        sysbvm_functionBytecodeAssembler_unreachable(context, (*compiler)->assembler);

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}